

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvBuilder.cpp
# Opt level: O0

Id __thiscall spv::Builder::createUnaryOp(Builder *this,Op opCode,Id typeId,Id operand)

{
  Block *this_00;
  Id resultId;
  Instruction *this_01;
  undefined4 in_register_00000034;
  unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> local_88;
  pointer local_80;
  Instruction *op;
  vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_> local_68;
  allocator_type local_41;
  vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_> local_40;
  Id local_24;
  Id local_20;
  Id operand_local;
  Id typeId_local;
  Op opCode_local;
  Builder *this_local;
  
  local_24 = operand;
  local_20 = typeId;
  operand_local = opCode;
  _typeId_local = this;
  if ((this->generatingOpCodeForSpecConst & 1U) == 0) {
    this_01 = (Instruction *)
              Instruction::operator_new((Instruction *)0x38,CONCAT44(in_register_00000034,opCode));
    resultId = getUniqueId(this);
    Instruction::Instruction(this_01,resultId,local_20,operand_local);
    local_80 = this_01;
    Instruction::addIdOperand(this_01,local_24);
    this_00 = this->buildPoint;
    std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>::
    unique_ptr<std::default_delete<spv::Instruction>,void>
              ((unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>> *)&local_88,
               local_80);
    Block::addInstruction(this_00,&local_88);
    std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::~unique_ptr
              (&local_88);
    this_local._4_4_ = Instruction::getResultId(local_80);
  }
  else {
    std::vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>::vector
              (&local_40,1,&local_24,&local_41);
    local_68.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl
    .super__Vector_impl_data._M_start = (pointer)0x0;
    local_68.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl
    .super__Vector_impl_data._M_finish = (pointer)0x0;
    local_68.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl
    .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>::vector(&local_68);
    this_local._4_4_ = createSpecConstantOp(this,opCode,typeId,&local_40,&local_68);
    std::vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>::~vector(&local_68);
    std::vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>::~vector(&local_40);
  }
  return this_local._4_4_;
}

Assistant:

Id Builder::createUnaryOp(Op opCode, Id typeId, Id operand)
{
    // Generate code for spec constants if in spec constant operation
    // generation mode.
    if (generatingOpCodeForSpecConst) {
        return createSpecConstantOp(opCode, typeId, dxil_spv::Vector<Id>(1, operand), dxil_spv::Vector<Id>());
    }
    Instruction* op = new Instruction(getUniqueId(), typeId, opCode);
    op->addIdOperand(operand);
    buildPoint->addInstruction(std::unique_ptr<Instruction>(op));

    return op->getResultId();
}